

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

void __thiscall
math::wide_integer::uintwide_t<256U,_unsigned_int,_void,_true>::shr<unsigned_int>
          (uintwide_t<256U,_unsigned_int,_void,_true> *this,uint n)

{
  ulong uVar1;
  sbyte sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar14;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  int iVar17;
  undefined1 auVar16 [16];
  
  uVar9 = 8;
  if (n >> 5 < 8) {
    uVar9 = n >> 5;
  }
  if (0x1f < n) {
    uVar11 = (ulong)(uVar9 * 4);
    if (n < 0x100) {
      lVar7 = -0x20;
      do {
        *(undefined4 *)((long)this[1].values.super_array<unsigned_int,_8UL>.elems + lVar7) =
             *(undefined4 *)
              ((long)this[1].values.super_array<unsigned_int,_8UL>.elems + lVar7 + uVar11);
        lVar7 = lVar7 + 4;
      } while (uVar11 + lVar7 != 0);
    }
    auVar5 = _DAT_001c2f90;
    auVar4 = _DAT_001c2f80;
    auVar3 = _DAT_001c2f10;
    iVar6 = (int)(this->values).super_array<unsigned_int,_8UL>.elems[7] >> 0x1f;
    uVar1 = uVar11 - 4;
    auVar16._8_4_ = (int)uVar1;
    auVar16._0_8_ = uVar1;
    auVar16._12_4_ = (int)(uVar1 >> 0x20);
    auVar13._0_8_ = uVar1 >> 2;
    auVar13._8_8_ = auVar16._8_8_ >> 2;
    uVar12 = 0;
    auVar13 = auVar13 ^ _DAT_001c2f10;
    do {
      auVar15._8_4_ = (int)uVar12;
      auVar15._0_8_ = uVar12;
      auVar15._12_4_ = (int)(uVar12 >> 0x20);
      auVar16 = (auVar15 | auVar5) ^ auVar3;
      iVar14 = auVar13._4_4_;
      if ((bool)(~(auVar16._4_4_ == iVar14 && auVar13._0_4_ < auVar16._0_4_ ||
                  iVar14 < auVar16._4_4_) & 1)) {
        *(int *)((long)this + uVar12 * 4 + (0x20 - uVar11)) = iVar6;
      }
      if ((auVar16._12_4_ != auVar13._12_4_ || auVar16._8_4_ <= auVar13._8_4_) &&
          auVar16._12_4_ <= auVar13._12_4_) {
        *(int *)((long)this + uVar12 * 4 + (0x24 - uVar11)) = iVar6;
      }
      auVar16 = (auVar15 | auVar4) ^ auVar3;
      iVar17 = auVar16._4_4_;
      if (iVar17 <= iVar14 && (iVar17 != iVar14 || auVar16._0_4_ <= auVar13._0_4_)) {
        *(int *)((long)this + uVar12 * 4 + (0x28 - uVar11)) = iVar6;
        *(int *)((long)this + uVar12 * 4 + (0x2c - uVar11)) = iVar6;
      }
      uVar12 = uVar12 + 4;
    } while (((uVar1 >> 2) + 4 & 0xfffffffffffffffc) != uVar12);
  }
  if (n < 0x100 && (n & 0x1f) != 0) {
    sVar2 = (sbyte)(n & 0x1f);
    uVar8 = ((uint)((int)(this->values).super_array<unsigned_int,_8UL>.elems[7] >> 0x1f) >>
            (-sVar2 & 0x1fU)) << (-sVar2 & 0x1fU);
    lVar7 = -(ulong)(uVar9 << 2);
    do {
      uVar9 = *(uint *)((long)(this->values).super_array<unsigned_int,_8UL>.elems + lVar7 + 0x1c);
      uVar10 = uVar9 >> sVar2 | uVar8;
      uVar8 = uVar9 << (0x20U - sVar2 & 0x1f);
      *(uint *)((long)(this->values).super_array<unsigned_int,_8UL>.elems + lVar7 + 0x1c) = uVar10;
      lVar7 = lVar7 + -4;
    } while (lVar7 != -0x20);
  }
  return;
}

Assistant:

constexpr auto shr(IntegralType n) -> void
    {
      const auto offset =
        (detail::min_unsafe)(static_cast<unsigned_fast_type>(static_cast<unsigned_fast_type>(n) / static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits)),
                             static_cast<unsigned_fast_type>(number_of_limbs));

      const auto right_shift_amount = static_cast<std::uint_fast16_t>(static_cast<unsigned_fast_type>(n) % static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits));

      if(static_cast<size_t>(offset) > static_cast<size_t>(UINT8_C(0)))
      {
        detail::copy_unsafe(detail::advance_and_point(values.cbegin(), static_cast<size_t>(offset)),
                            detail::advance_and_point(values.cbegin(), static_cast<size_t>(number_of_limbs)),
                            values.begin());

        detail::fill_unsafe(detail::advance_and_point(values.begin(), static_cast<size_t>(static_cast<size_t>(number_of_limbs) - static_cast<size_t>(offset))),
                            values.end(),
                            right_shift_fill_value());
      }

      using local_integral_type = unsigned_fast_type;

      if(right_shift_amount != static_cast<local_integral_type>(UINT8_C(0)))
      {
        auto part_from_previous_value =
          static_cast<limb_type>
          (
            (!is_neg(*this))
              ? static_cast<limb_type>(UINT8_C(0))
              : static_cast<limb_type>((std::numeric_limits<limb_type>::max)() << static_cast<std::uint_fast16_t>(static_cast<std::uint_fast16_t>(std::numeric_limits<limb_type>::digits) - right_shift_amount))
          );

        auto r_ai =
          static_cast<reverse_iterator>
          (
            detail::advance_and_point
            (
              values.begin(),
              static_cast<signed_fast_type>
              (
                static_cast<unsigned_fast_type>(number_of_limbs) - offset
              )
            )
          );

        while(r_ai != values.rend()) // NOLINT(altera-id-dependent-backward-branch)
        {
          const auto t = *r_ai;

          *r_ai++ = static_cast<limb_type>(static_cast<limb_type>(t >> static_cast<local_integral_type>(right_shift_amount)) | part_from_previous_value);

          const auto left_shift_previous_value =
            static_cast<local_integral_type>
            (
              static_cast<unsigned_fast_type>
              (
                  static_cast<std::int_fast32_t>(std::numeric_limits<limb_type>::digits)
                - static_cast<std::int_fast32_t>(right_shift_amount)
              )
            );

          part_from_previous_value = static_cast<limb_type>(t << left_shift_previous_value);
        }
      }
    }